

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::grabGesture
          (QGraphicsScenePrivate *this,QGraphicsItem *param_1,GestureType gesture)

{
  int iVar1;
  QGraphicsView **ppQVar2;
  long lVar3;
  int *piVar4;
  QWidget *this_00;
  long lVar5;
  long in_FS_OFFSET;
  GestureType local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = gesture;
  QGestureManager::instance(ForceCreation);
  piVar4 = QHash<Qt::GestureType,_int>::operator[](&this->grabbedGestures,&local_24);
  iVar1 = *piVar4;
  *piVar4 = iVar1 + 1;
  if (iVar1 == 0) {
    ppQVar2 = (this->views).d.ptr;
    lVar3 = (this->views).d.size;
    for (lVar5 = 0; lVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)((long)ppQVar2 + lVar5));
      QWidget::grabGesture(this_00,local_24,(GestureFlags)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabGesture(QGraphicsItem *, Qt::GestureType gesture)
{
    (void)QGestureManager::instance(); // create a gesture manager
    if (!grabbedGestures[gesture]++) {
        for (QGraphicsView *view : std::as_const(views))
            view->viewport()->grabGesture(gesture);
    }
}